

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

void __thiscall DEnterKey::SetMenuMessage(DEnterKey *this,int which)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  FOptionMenuItem *pFVar4;
  DMenu *pDVar5;
  bool bVar6;
  FName local_24;
  PClass *pPVar3;
  
  pDVar5 = (this->super_DMenu).mParentMenu.field_0.p;
  if (pDVar5 != (DMenu *)0x0) {
    if (((pDVar5->super_DObject).ObjectFlags & 0x20) == 0) goto LAB_00312540;
    (this->super_DMenu).mParentMenu.field_0.p = (DMenu *)0x0;
  }
  pDVar5 = (DMenu *)0x0;
LAB_00312540:
  pPVar1 = DOptionMenu::RegistrationInfo.MyClass;
  pPVar3 = (pDVar5->super_DObject).Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(pDVar5->super_DObject)._vptr_DObject)(pDVar5);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (pDVar5->super_DObject).Class = pPVar3;
  }
  bVar6 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar1 && bVar6) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar6 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar1) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (bVar6) {
    pFVar4 = DOptionMenu::GetItem
                       ((DOptionMenu *)(this->super_DMenu).mParentMenu.field_0.p,&local_24);
    if (pFVar4 != (FOptionMenuItem *)0x0) {
      (*(pFVar4->super_FListMenuItem)._vptr_FListMenuItem[10])(pFVar4,0,which);
    }
  }
  return;
}

Assistant:

void SetMenuMessage(int which)
	{
		if (mParentMenu->IsKindOf(RUNTIME_CLASS(DOptionMenu)))
		{
			DOptionMenu *m = barrier_cast<DOptionMenu*>(mParentMenu);
			FListMenuItem *it = m->GetItem(NAME_Controlmessage);
			if (it != NULL)
			{
				it->SetValue(0, which);
			}
		}
	}